

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O1

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode *table,uint8_t *code_lengths,uint16_t *count)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  int local_98 [4];
  int local_88;
  int local_84;
  uint16_t local_78 [4];
  int offset [6];
  int sorted [18];
  
  local_98[1] = count[1] - 1;
  local_98[2] = (uint)count[1] + (uint)count[2] + -1;
  local_98[3] = (uint)count[3] + local_98[2];
  local_88 = (uint)count[4] + local_98[3];
  local_84 = (uint)count[5] + local_88;
  local_98[0] = 0x11;
  lVar4 = 0;
  do {
    iVar3 = local_98[code_lengths[lVar4 + 0x11]];
    local_98[code_lengths[lVar4 + 0x11]] = iVar3 + -1;
    iVar2 = (int)lVar4;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0x11;
    iVar3 = local_98[code_lengths[lVar4 + 0x10]];
    local_98[code_lengths[lVar4 + 0x10]] = iVar3 + -1;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0x10;
    iVar3 = local_98[code_lengths[lVar4 + 0xf]];
    local_98[code_lengths[lVar4 + 0xf]] = iVar3 + -1;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0xf;
    iVar3 = local_98[code_lengths[lVar4 + 0xe]];
    local_98[code_lengths[lVar4 + 0xe]] = iVar3 + -1;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0xe;
    iVar3 = local_98[code_lengths[lVar4 + 0xd]];
    local_98[code_lengths[lVar4 + 0xd]] = iVar3 + -1;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0xd;
    iVar3 = local_98[code_lengths[lVar4 + 0xc]];
    local_98[code_lengths[lVar4 + 0xc]] = iVar3 + -1;
    *(int *)(local_78 + (long)iVar3 * 2) = iVar2 + 0xc;
    lVar4 = lVar4 + -6;
  } while (lVar4 != -0x12);
  if (local_98[0] == 0) {
    lVar4 = 0;
    do {
      table[lVar4].bits = '\0';
      table[lVar4].value = local_78[0];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  else {
    iVar3 = 2;
    uVar5 = 0x80;
    lVar4 = 0;
    lVar6 = 1;
    lVar7 = 0;
    do {
      uVar8 = (uint)count[lVar6];
      if (count[lVar6] != 0) {
        lVar4 = (long)(int)lVar4;
        do {
          iVar2 = *(int *)(local_78 + lVar4 * 2);
          bVar1 = ""[lVar7];
          lVar9 = 0x20;
          do {
            table[((ulong)bVar1 + lVar9) - (long)iVar3] = (HuffmanCode)(iVar2 << 0x10 | (uint)lVar6)
            ;
            bVar10 = SCARRY8(lVar9,(long)-iVar3);
            lVar9 = lVar9 + -iVar3;
          } while (lVar9 != 0 && bVar10 == lVar9 < 0);
          lVar4 = lVar4 + 1;
          lVar7 = lVar7 + uVar5;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      iVar3 = iVar3 * 2;
      uVar5 = uVar5 >> 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
  }
  return;
}

Assistant:

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode* table,
                                        const uint8_t* const code_lengths,
                                        uint16_t* count) {
  HuffmanCode code; /* current table entry */
  int symbol;       /* symbol index in original or sorted table */
  reg_t key;        /* prefix code */
  reg_t key_step;   /* prefix code addend */
  int step;         /* step size to replicate values in current table */
  int table_size;   /* size of current table */
  int sorted[BROTLI_CODE_LENGTH_CODES];  /* symbols sorted by code length */
  /* offsets in sorted table for each length */
  int offset[BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1];
  int bits;
  int bits_count;
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH <=
                BROTLI_REVERSE_BITS_MAX);

  /* generate offsets into sorted symbol table by code length */
  symbol = -1;
  bits = 1;
  BROTLI_REPEAT(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH, {
    symbol += count[bits];
    offset[bits] = symbol;
    bits++;
  });
  /* Symbols with code length 0 are placed after all other symbols. */
  offset[0] = BROTLI_CODE_LENGTH_CODES - 1;

  /* sort symbols by length, by symbol order within each length */
  symbol = BROTLI_CODE_LENGTH_CODES;
  do {
    BROTLI_REPEAT(6, {
      symbol--;
      sorted[offset[code_lengths[symbol]]--] = symbol;
    });
  } while (symbol != 0);

  table_size = 1 << BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH;

  /* Special case: all symbols but one have 0 code length. */
  if (offset[0] == 0) {
    code.bits = 0;
    code.value = (uint16_t)sorted[0];
    for (key = 0; key < (reg_t)table_size; ++key) {
      table[key] = code;
    }
    return;
  }

  /* fill in table */
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  symbol = 0;
  bits = 1;
  step = 2;
  do {
    code.bits = (uint8_t)bits;
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      code.value = (uint16_t)sorted[symbol++];
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH);
}